

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall
cmake::ReadListFile(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,char *path)

{
  _Base_ptr p_Var1;
  cmGlobalGenerator *pcVar2;
  pointer args_00;
  bool bVar3;
  cmGlobalGenerator *this_00;
  char *pcVar4;
  cmMakefile *this_01;
  size_t sVar5;
  bool collapse;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 collapse_00;
  bool collapse_01;
  bool collapse_02;
  auto_ptr<cmMakefile> mf;
  string file;
  string homeOutputDir;
  string homeDir;
  cmStateSnapshot snapshot;
  auto_ptr<cmMakefile> local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  undefined1 local_b0 [32];
  pointer local_90;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  cmStateSnapshot local_48;
  
  pcVar2 = this->GlobalGenerator;
  this_00 = pcVar2;
  if (pcVar2 == (cmGlobalGenerator *)0x0) {
    this_00 = (cmGlobalGenerator *)operator_new(0x5c8);
    cmGlobalGenerator::cmGlobalGenerator(this_00,this);
  }
  if (path != (char *)0x0) {
    cmState::Reset((cmStateSnapshot *)local_d8,this->State);
    (this->CurrentSnapshot).Position.Position = local_c8._0_8_;
    (this->CurrentSnapshot).State = (cmState *)local_d8._0_8_;
    (this->CurrentSnapshot).Position.Tree =
         (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_d8._8_8_;
    pcVar4 = cmState::GetSourceDirectory(this->State);
    std::__cxx11::string::string((string *)local_68,pcVar4,(allocator *)local_d8);
    pcVar4 = cmState::GetBinaryDirectory(this->State);
    std::__cxx11::string::string((string *)local_88,pcVar4,(allocator *)local_d8);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_d8,(SystemTools *)0x1,collapse);
    SetHomeDirectory(this,(string *)local_d8);
    collapse_00 = extraout_DL;
    if ((cmState *)local_d8._0_8_ != (cmState *)local_c8) {
      operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
      collapse_00 = extraout_DL_00;
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_d8,(SystemTools *)0x1,(bool)collapse_00);
    local_90 = (pointer)args;
    SetHomeOutputDirectory(this,(string *)local_d8);
    if ((cmState *)local_d8._0_8_ != (cmState *)local_c8) {
      operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
    }
    local_48.Position.Position = (this->CurrentSnapshot).Position.Position;
    local_48.State = (this->CurrentSnapshot).State;
    local_48.Position.Tree = (this->CurrentSnapshot).Position.Tree;
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_d8,&local_48);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_b0,(SystemTools *)0x1,collapse_01);
    cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_d8,(string *)local_b0);
    p_Var1 = (_Base_ptr)(local_b0 + 0x10);
    if ((_Base_ptr)local_b0._0_8_ != p_Var1) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_d8,&local_48);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_b0,(SystemTools *)0x1,collapse_02);
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_d8,(string *)local_b0);
    if ((_Base_ptr)local_b0._0_8_ != p_Var1) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    cmStateSnapshot::SetDefaultDefinitions(&local_48);
    this_01 = (cmMakefile *)operator_new(0x760);
    cmMakefile::cmMakefile(this_01,this_00,&local_48);
    local_e0.x_ = this_01;
    if (this->CurrentWorkingMode != NORMAL_MODE) {
      local_b0._0_8_ = p_Var1;
      sVar5 = strlen(path);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,path,path + sVar5);
      cmsys::SystemTools::CollapseFullPath((string *)local_d8,(string *)local_b0);
      if ((_Base_ptr)local_b0._0_8_ != p_Var1) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_d8);
      args_00 = local_90;
      cmMakefile::SetScriptModeFile(local_e0.x_,(char *)local_d8._0_8_);
      cmMakefile::SetArgcArgv
                (local_e0.x_,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)args_00);
      if ((cmState *)local_d8._0_8_ != (cmState *)local_c8) {
        operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
      }
    }
    bVar3 = cmMakefile::ReadListFile(local_e0.x_,path);
    if (!bVar3) {
      cmSystemTools::Error("Error processing file: ",path,(char *)0x0,(char *)0x0);
    }
    SetHomeDirectory(this,(string *)local_68);
    SetHomeOutputDirectory(this,(string *)local_88);
    ::cm::auto_ptr<cmMakefile>::~auto_ptr(&local_e0);
    if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if ((_Base_ptr)local_68._0_8_ != (_Base_ptr)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  if (pcVar2 == (cmGlobalGenerator *)0x0) {
    (*this_00->_vptr_cmGlobalGenerator[1])(this_00);
  }
  return;
}

Assistant:

void cmake::ReadListFile(const std::vector<std::string>& args,
                         const char* path)
{
  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator* gg = this->GetGlobalGenerator();
  bool created = false;

  // if a generator was not specified use a generic one
  if (!gg) {
    gg = new cmGlobalGenerator(this);
    created = true;
  }

  // read in the list file to fill the cache
  if (path) {
    this->CurrentSnapshot = this->State->Reset();
    std::string homeDir = this->GetHomeDirectory();
    std::string homeOutputDir = this->GetHomeOutputDirectory();
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    cmStateSnapshot snapshot = this->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentBinary(
      cmSystemTools::GetCurrentWorkingDirectory());
    snapshot.GetDirectory().SetCurrentSource(
      cmSystemTools::GetCurrentWorkingDirectory());
    snapshot.SetDefaultDefinitions();
    CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(gg, snapshot));
    if (this->GetWorkingMode() != NORMAL_MODE) {
      std::string file(cmSystemTools::CollapseFullPath(path));
      cmSystemTools::ConvertToUnixSlashes(file);
      mf->SetScriptModeFile(file.c_str());

      mf->SetArgcArgv(args);
    }
    if (!mf->ReadListFile(path)) {
      cmSystemTools::Error("Error processing file: ", path);
    }
    this->SetHomeDirectory(homeDir);
    this->SetHomeOutputDirectory(homeOutputDir);
  }

  // free generic one if generated
  if (created) {
    delete gg;
  }
}